

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFilter_listOfFilters_Test::~TEST_TestFilter_listOfFilters_Test
          (TEST_TestFilter_listOfFilters_Test *this)

{
  TEST_TestFilter_listOfFilters_Test *this_local;
  
  ~TEST_TestFilter_listOfFilters_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(TestFilter, listOfFilters)
{
    TestFilter *listOfFilters = NULLPTR;
    TestFilter first("foo");
    TestFilter secnd("bar");
    listOfFilters = first.add(listOfFilters);
    listOfFilters = secnd.add(listOfFilters);
    TestFilter *current = listOfFilters;
    STRCMP_EQUAL("TestFilter: \"bar\"", StringFrom(*current).asCharString());
    current = current->getNext();
    STRCMP_EQUAL("TestFilter: \"foo\"", StringFrom(*current).asCharString());
    POINTERS_EQUAL(NULLPTR, current->getNext());
}